

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
Array_AllItemsMustBeOfOneType2_Test::TestBody(Array_AllItemsMustBeOfOneType2_Test *this)

{
  bool bVar1;
  AssertHelper local_208;
  Message local_200 [2];
  parser_error_t *anon_var_0;
  char *pcStack_1e8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  events_aggregator_t handler;
  allocator local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream input;
  Array_AllItemsMustBeOfOneType2_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"key = [1, \'abc\']",&local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe18,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe18);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      loltoml::v_0_1_1::parse<events_aggregator_t>
                ((istream *)local_190,(events_aggregator_t *)&gtest_msg);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0017e741;
    pcStack_1e8 = 
    "Expected: loltoml::parse(input, handler) throws an exception of type loltoml::parser_error_t.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_200);
  testing::internal::AssertHelper::AssertHelper
            (&local_208,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/array.cpp"
             ,0x119,pcStack_1e8);
  testing::internal::AssertHelper::operator=(&local_208,local_200);
  testing::internal::AssertHelper::~AssertHelper(&local_208);
  testing::Message::~Message(local_200);
LAB_0017e741:
  events_aggregator_t::~events_aggregator_t((events_aggregator_t *)&gtest_msg);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

TEST(Array, AllItemsMustBeOfOneType2) {
    std::istringstream input("key = [1, 'abc']");
    events_aggregator_t handler;

    EXPECT_THROW(loltoml::parse(input, handler), loltoml::parser_error_t);
}